

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::PRE::PreloadPRECandidates(PRE *this,Loop *loop)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint sourceContextId;
  uint functionId;
  Instr *pIVar4;
  Instr *pIVar5;
  undefined4 *puVar6;
  Type *ppHVar7;
  GlobHashBucket **candidate;
  EditingIterator iter;
  BOOL changed;
  Loop *loop_local;
  PRE *this_local;
  
  iter.super_EditingIterator.last._4_4_ = 1;
  if ((this->candidates != (PRECandidates *)0x0) &&
     (this->candidates->candidatesList != (PRECandidatesList *)0x0)) {
    pIVar4 = BasicBlock::GetFirstInstr(loop->landingPad);
    pIVar5 = BasicBlock::GetLastInstr(loop->landingPad);
    if (pIVar4 != pIVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x475,
                         "(loop->landingPad->GetFirstInstr() == loop->landingPad->GetLastInstr())",
                         "loop->landingPad->GetFirstInstr() == loop->landingPad->GetLastInstr()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    while (iter.super_EditingIterator.last._4_4_ != 0) {
      iter.super_EditingIterator.last._4_4_ = 0;
      SList<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
                ((EditingIterator *)&candidate,
                 (SList<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount> *)
                 this->candidates->candidatesList);
      while (bVar2 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount>::
                     EditingIterator::Next((EditingIterator *)&candidate), bVar2) {
        ppHVar7 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data((Iterator *)&candidate);
        BVar3 = PreloadPRECandidate(this,loop,*ppHVar7);
        if (BVar3 != 0) {
          iter.super_EditingIterator.last._4_4_ = 1;
          SList<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
          RemoveCurrent((EditingIterator *)&candidate);
        }
        sourceContextId = Func::GetSourceContextId(this->globOpt->func);
        functionId = Func::GetLocalFunctionId(this->globOpt->func);
        bVar2 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01ec1678,FieldPREPhase,sourceContextId,functionId);
        if (bVar2) {
          Output::Print(L"============================\n");
          Output::Flush();
        }
      }
    }
  }
  return;
}

Assistant:

void GlobOpt::PRE::PreloadPRECandidates(Loop *loop)
{
    // Insert loads in landing pad for field PRE candidates. Iterate while(changed)
    // for the o.x.y cases.
    BOOL changed = true;

    if (!candidates || !candidates->candidatesList)
    {
        return;
    }

    Assert(loop->landingPad->GetFirstInstr() == loop->landingPad->GetLastInstr());

    while (changed)
    {
        changed = false;
        FOREACH_SLIST_ENTRY_EDITING(GlobHashBucket*, candidate, (SList<GlobHashBucket*>*)candidates->candidatesList, iter)
        {
            if (this->PreloadPRECandidate(loop, candidate))
            {
                changed = true;
                iter.RemoveCurrent();
            }
            if (PHASE_TRACE(Js::FieldPREPhase, this->globOpt->func))
            {
                Output::Print(_u("============================\n"));
                Output::Flush();
            }
        } NEXT_SLIST_ENTRY_EDITING;
    }
}